

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_is_destination
              (quicly_conn_t *conn,sockaddr *dest_addr,sockaddr *src_addr,
              quicly_decoded_packet_t *decoded)

{
  size_t __n;
  int iVar1;
  quicly_cid_t *__s1;
  
  if ((char)*(decoded->octets).base < '\0') {
    iVar1 = compare_socket_address(&(conn->super).remote.address.sa,src_addr);
    if (iVar1 != 0) {
      return 0;
    }
    if (((conn->super).local.address.sa.sa_family != 0) &&
       (iVar1 = compare_socket_address(&(conn->super).local.address.sa,dest_addr), iVar1 != 0)) {
      return 0;
    }
    if ((((conn->super).local.bidi.next_stream_id & 1) != 0) &&
       (((decoded->cid).dest.field_0x20 & 1) != 0)) {
      __s1 = &conn->retry_scid;
      if ((conn->retry_scid).len == 0xff) {
        __s1 = &(conn->super).original_dcid;
      }
      __n = (decoded->cid).dest.encrypted.len;
      if ((__n == __s1->len) &&
         (iVar1 = bcmp(__s1,(decoded->cid).dest.encrypted.base,__n), iVar1 == 0)) goto LAB_00127335;
    }
  }
  if (((conn->super).ctx)->cid_encryptor == (quicly_cid_encryptor_t *)0x0) {
    iVar1 = compare_socket_address(&(conn->super).remote.address.sa,src_addr);
    if (iVar1 != 0) {
      if ((conn->super).local.address.sa.sa_family != 0) {
        compare_socket_address(&(conn->super).local.address.sa,dest_addr);
        return 0;
      }
      return 0;
    }
  }
  else if ((((conn->super).local.cid_set.plaintext.master_id !=
             (decoded->cid).dest.plaintext.master_id) ||
           (0xff < (*(uint *)&(decoded->cid).dest.plaintext.field_0x4 ^
                   *(uint *)&(conn->super).local.cid_set.plaintext.field_0x4))) ||
          ((conn->super).local.cid_set.plaintext.node_id != (decoded->cid).dest.plaintext.node_id))
  {
    iVar1 = is_stateless_reset(conn,decoded);
    if (iVar1 != 0) {
      decoded->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
      return 1;
    }
    return 0;
  }
LAB_00127335:
  decoded->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
  return 1;
}

Assistant:

int quicly_is_destination(quicly_conn_t *conn, struct sockaddr *dest_addr, struct sockaddr *src_addr,
                          quicly_decoded_packet_t *decoded)
{
    if (QUICLY_PACKET_IS_LONG_HEADER(decoded->octets.base[0])) {
        /* long header: validate address, then consult the CID */
        if (compare_socket_address(&conn->super.remote.address.sa, src_addr) != 0)
            return 0;
        if (conn->super.local.address.sa.sa_family != AF_UNSPEC &&
            compare_socket_address(&conn->super.local.address.sa, dest_addr) != 0)
            return 0;
        /* server may see the CID generated by the client for Initial and 0-RTT packets */
        if (!quicly_is_client(conn) && decoded->cid.dest.might_be_client_generated) {
            const quicly_cid_t *odcid = is_retry(conn) ? &conn->retry_scid : &conn->super.original_dcid;
            if (quicly_cid_is_equal(odcid, decoded->cid.dest.encrypted))
                goto Found;
        }
    }

    if (conn->super.ctx->cid_encryptor != NULL) {
        /* Note on multiple CIDs
         * Multiple CIDs issued by this host are always based on the same 3-tuple (master_id, thread_id, node_id)
         * and the only difference is path_id. Therefore comparing the 3-tuple is enough to cover all CIDs issued by
         * this host.
         */
        if (conn->super.local.cid_set.plaintext.master_id == decoded->cid.dest.plaintext.master_id &&
            conn->super.local.cid_set.plaintext.thread_id == decoded->cid.dest.plaintext.thread_id &&
            conn->super.local.cid_set.plaintext.node_id == decoded->cid.dest.plaintext.node_id)
            goto Found;
        if (is_stateless_reset(conn, decoded))
            goto Found_StatelessReset;
    } else {
        if (compare_socket_address(&conn->super.remote.address.sa, src_addr) == 0)
            goto Found;
        if (conn->super.local.address.sa.sa_family != AF_UNSPEC &&
            compare_socket_address(&conn->super.local.address.sa, dest_addr) != 0)
            return 0;
    }

    /* not found */
    return 0;

Found:
    decoded->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
    return 1;

Found_StatelessReset:
    decoded->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
    return 1;
}